

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

void Image_Function_Helper::Rotate
               (RotateForm4 rotate,Image *in,double centerXIn,double centerYIn,Image *out,
               double centerXOut,double centerYOut,double angle)

{
  ImageTemplate<unsigned_char> local_48;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in,out);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_48,out);
  Image_Function::
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_48);
  (*rotate)(in,0,0,centerXIn,centerYIn,out,0,0,centerXOut,centerYOut,in->_width,in->_height,angle);
  return;
}

Assistant:

void Rotate( FunctionTable::RotateForm4 rotate,
                 const Image & in, double centerXIn, double centerYIn, Image & out, double centerXOut, double centerYOut, double angle )
    {
        Image_Function::ParameterValidation( in, out );
        Image_Function::VerifyGrayScaleImage( in, out );
        rotate( in, 0, 0, centerXIn, centerYIn, out, 0, 0, centerXOut, centerYOut, in.width(), in.height(), angle );
    }